

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

string * __thiscall
soul::ResolutionPass::FunctionResolver::findPossibleMisspeltFunction
          (string *__return_storage_ptr__,FunctionResolver *this,string *name)

{
  ModuleBase *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *__s;
  Scope *local_d0;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  string local_80;
  Scope *local_50;
  Scope *topLevelScope;
  size_t lowestDistance;
  string nearest;
  string *name_local;
  FunctionResolver *this_local;
  
  nearest.field_2._8_8_ = name;
  std::__cxx11::string::string((string *)&lowestDistance);
  topLevelScope = (Scope *)0x5;
  pMVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).module;
  local_d0 = (Scope *)0x0;
  if (pMVar1 != (ModuleBase *)0x0) {
    local_d0 = &pMVar1->super_Scope;
  }
  local_50 = local_d0;
  while( true ) {
    iVar2 = (*local_50->_vptr_Scope[4])();
    if (CONCAT44(extraout_var,iVar2) == 0) break;
    iVar2 = (*local_50->_vptr_Scope[4])();
    local_50 = (Scope *)CONCAT44(extraout_var_00,iVar2);
  }
  findLeastMisspeltFunction
            (local_50,(string *)nearest.field_2._8_8_,(string *)&lowestDistance,
             (size_t *)&topLevelScope);
  std::__cxx11::string::string((string *)&local_a0,(string *)&lowestDistance);
  Program::stripRootNamespaceFromQualifiedPath(&local_80,&local_a0);
  std::__cxx11::string::operator=((string *)&lowestDistance,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  __s = getIntrinsicsNamespaceName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,__s,&local_c1);
  TokenisedPathString::removeTopLevelNameIfPresent
            (__return_storage_ptr__,(string *)&lowestDistance,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&lowestDistance);
  return __return_storage_ptr__;
}

Assistant:

std::string findPossibleMisspeltFunction (const std::string& name)
        {
            std::string nearest;
            size_t lowestDistance = 5;

            AST::Scope* topLevelScope = std::addressof (module);

            while (topLevelScope->getParentScope() != nullptr)
                topLevelScope = topLevelScope->getParentScope();

            findLeastMisspeltFunction (*topLevelScope, name, nearest, lowestDistance);

            nearest = Program::stripRootNamespaceFromQualifiedPath (nearest);
            return TokenisedPathString::removeTopLevelNameIfPresent (nearest, getIntrinsicsNamespaceName());
        }